

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

void __thiscall
mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
          (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *this,LinTerms *le,AlgConRange rr,
          bool fSort)

{
  undefined3 in_register_00000011;
  
  (this->super_BasicConstraint).name_._M_dataplus._M_p =
       (pointer)&(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_string_length = 0;
  (this->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  LinTerms::LinTerms(&this->super_LinTerms,le);
  (this->super_AlgConRange).lb_ = rr.lb_;
  (this->super_AlgConRange).ub_ = rr.ub_;
  if (CONCAT31(in_register_00000011,fSort) != 0) {
    sort_terms(this);
  }
  return;
}

Assistant:

AlgebraicConstraint(Body le, RhsOrRange rr, bool fSort=true)
    : Body(std::move(le)), RhsOrRange(std::move(rr))
  { if (fSort) sort_terms(); }